

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Slave *this;
  Slave *s;
  undefined1 local_48 [4];
  int i;
  Master m;
  char **argv_local;
  int argc_local;
  
  m.slaves.super__Vector_base<Slave_*,_std::allocator<Slave_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  Master::Master((Master *)local_48);
  for (s._4_4_ = 1; s._4_4_ < 5; s._4_4_ = s._4_4_ + 1) {
    this = (Slave *)operator_new(4);
    Slave::Slave(this,s._4_1_);
    Master::add_slave((Master *)local_48,this);
  }
  Master::run((Master *)local_48);
  Master::~Master((Master *)local_48);
  return 0;
}

Assistant:

int main(int argc, char ** argv) {


	Master m;
	for (int i = 1; i < 5; ++i) {
		auto s = new Slave(i);
		m.add_slave(s);
	}
	m.run();
	return 0;
}